

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::process_cmdline(QApplicationPrivate *this)

{
  char *pcVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  storage_type *psVar8;
  char *__s1;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  char *local_80;
  QByteArrayView local_78;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_topLevelAt == 0) {
    qEnvironmentVariable((char *)&local_58);
    lVar7 = _topLevelAt;
    pcVar3 = _create;
    pDVar2 = QGuiApplicationPrivate::styleOverride;
    QGuiApplicationPrivate::styleOverride = local_58.d;
    _create = local_58.ptr;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    _topLevelAt = local_58.size;
    local_58.size = lVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if ((qt_is_tty_app == '\0') && (iVar5 = **(int **)&this->field_0x80, iVar5 != 0)) {
    iVar6 = 1;
    for (iVar9 = 1; lVar7 = (long)iVar6, iVar9 < iVar5; iVar9 = iVar9 + 1) {
      lVar10 = (long)iVar9;
      pcVar1 = *(char **)(*(long *)&this->field_0x88 + lVar10 * 8);
      if (pcVar1 != (char *)0x0) {
        if (*pcVar1 == '-') {
          __s1 = pcVar1 + 1;
          if (pcVar1[1] != '-') {
            __s1 = pcVar1;
          }
          iVar4 = strcmp(__s1,"-qdevel");
          if ((iVar4 != 0) && (iVar4 = strcmp(__s1,"-qdebug"), iVar4 != 0)) {
            iVar4 = strcmp(__s1,"-stylesheet");
            if ((iVar4 == 0) && (iVar9 < iVar5 + -1)) {
              QString::operator=(&styleSheet,(QLatin1String *)0x8);
              iVar9 = iVar9 + 1;
              QByteArrayView::QByteArrayView<char_*,_true>
                        (&local_68,(char **)(*(long *)&this->field_0x88 + lVar10 * 8 + 8));
              psVar8 = (storage_type *)local_68.m_size;
            }
            else {
              iVar5 = strncmp(__s1,"-stylesheet=",0xc);
              if (iVar5 != 0) {
                iVar5 = qstrcmp(__s1,"-widgetcount");
                if (iVar5 == 0) {
                  widgetCount = true;
                }
                else {
                  iVar6 = iVar6 + 1;
                  *(undefined8 *)(*(long *)&this->field_0x88 + lVar7 * 8) =
                       *(undefined8 *)(*(long *)&this->field_0x88 + lVar10 * 8);
                }
                goto LAB_002ba3e1;
              }
              QString::operator=(&styleSheet,(QLatin1String *)0x8);
              local_80 = __s1 + 0xc;
              QByteArrayView::QByteArrayView<const_char_*,_true>(&local_78,&local_80);
              psVar8 = (storage_type *)local_78.m_size;
            }
            QVar11.m_data = psVar8;
            QVar11.m_size = (qsizetype)&local_58;
            QString::fromLocal8Bit(QVar11);
            QString::append((QString *)&styleSheet);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          }
        }
        else {
          iVar6 = iVar6 + 1;
          *(char **)(*(long *)&this->field_0x88 + lVar7 * 8) = pcVar1;
        }
      }
LAB_002ba3e1:
      iVar5 = **(int **)&this->field_0x80;
    }
    if (iVar6 < iVar5) {
      *(undefined8 *)(*(long *)&this->field_0x88 + lVar7 * 8) = 0;
      **(int **)&this->field_0x80 = iVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::process_cmdline()
{
    if (styleOverride.isEmpty())
        styleOverride = qEnvironmentVariable("QT_STYLE_OVERRIDE");

    // process platform-indep command line
    if (qt_is_tty_app || !argc)
        return;

    int i, j;

    j = 1;
    for (i=1; i<argc; i++) { // if you add anything here, modify QCoreApplication::arguments()
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-qdevel") == 0 || strcmp(arg, "-qdebug") == 0) {
            // obsolete argument
#ifndef QT_NO_STYLE_STYLESHEET
        } else if (strcmp(arg, "-stylesheet") == 0 && i < argc -1) {
            styleSheet = "file:///"_L1;
            styleSheet.append(QString::fromLocal8Bit(argv[++i]));
        } else if (strncmp(arg, "-stylesheet=", 12) == 0) {
            styleSheet = "file:///"_L1;
            styleSheet.append(QString::fromLocal8Bit(arg + 12));
#endif
        } else if (qstrcmp(arg, "-widgetcount") == 0) {
            widgetCount = true;
        } else {
            argv[j++] = argv[i];
        }
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }
}